

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip-test.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_0::MockOutputStream::write(MockOutputStream *this,int __fd,void *__buf,size_t __n)

{
  ssize_t in_RAX;
  ssize_t extraout_RAX;
  long lVar1;
  undefined4 in_register_00000034;
  ArrayPtr<const_unsigned_char> *container;
  ArrayPtr<const_unsigned_char> *__begin2;
  
  container = (ArrayPtr<const_unsigned_char> *)CONCAT44(in_register_00000034,__fd);
  for (lVar1 = (long)__buf << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
    Vector<unsigned_char>::addAll<kj::ArrayPtr<unsigned_char_const>const&>(&this->bytes,container);
    container = container + 1;
    in_RAX = extraout_RAX;
  }
  return in_RAX;
}

Assistant:

void write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    for (auto& piece: pieces) {
      bytes.addAll(piece);
    }
  }